

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O1

vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> * __thiscall
mxx::impl::
sample_block_decomp<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>>
          (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
           *__return_storage_ptr__,impl *this,long begin,size_type end,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *param_5,char *param_6)

{
  impl *piVar1;
  long lVar2;
  void *pvVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_sizes;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_splitters;
  value_type my_splitter;
  allocator_type local_71;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_70;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_58;
  pair<int,_int> local_40;
  value_type_conflict2 local_38;
  
  if (begin - (long)this == 0) {
    MPI_Comm_rank(&ompi_mpi_comm_world,&local_58);
    param_6 = "local_size > 0";
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",
           (ulong)(uint)local_58.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
           "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/samplesort.hpp"
           ,0xa1);
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
  }
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            (&local_58,end,(allocator_type *)&local_70);
  lVar2 = CONCAT44(local_58.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start._4_4_,
                   (uint)local_58.
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
  if ((long)local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish - lVar2 != 0) {
    uVar6 = begin - (long)this >> 3;
    lVar4 = (long)local_58.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish - lVar2 >> 3;
    uVar5 = 0;
    do {
      piVar1 = this + ((uVar6 / (end + 1) - 1) + (ulong)(uVar5 < uVar6 % (end + 1))) * 8;
      this = piVar1 + 8;
      *(undefined4 *)(lVar2 + uVar5 * 8) = *(undefined4 *)piVar1;
      param_6 = (char *)(ulong)*(uint *)(piVar1 + 4);
      *(uint *)(lVar2 + 4 + uVar5 * 8) = *(uint *)(piVar1 + 4);
      uVar5 = uVar5 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != uVar5);
  }
  bitonic_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>>
            (lVar2,local_58.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish,param_5);
  local_40 = local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1];
  local_38 = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_70,
             (long)*(int *)&(param_5->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_end_of_storage,&local_38,&local_71);
  local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish[-1] = 0;
  allgatherv<std::pair<int,int>>
            (__return_storage_ptr__,(mxx *)&local_40,
             (pair<int,_int> *)
             (ulong)(*(int *)((long)&(param_5->
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     )._M_impl.super__Vector_impl_data._M_end_of_storage + 4) + 1 <
                    *(int *)&(param_5->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_end_of_storage),(size_t)&local_70,
             param_5,(comm *)param_6);
  if (local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar3 = (void *)CONCAT44(local_58.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            (uint)local_58.
                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_58.
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<typename std::iterator_traits<_Iterator>::value_type>
sample_block_decomp(_Iterator begin, _Iterator end, _Compare comp, size_t s, const mxx::comm& comm) {
    typedef typename std::iterator_traits<_Iterator>::value_type value_type;
    size_t local_size = std::distance(begin, end);
    MXX_ASSERT(local_size > 0);

    // 1. samples
    //  - pick `s` samples equally spaced such that `s` samples define `s+1`
    //    subsequences in the sorted order
    std::vector<value_type> local_splitters(s);
    _Iterator pos = begin;
    for (size_t i = 0; i < local_splitters.size(); ++i) {
        size_t bucket_size = local_size / (s+1) + (i < (local_size % (s+1)) ? 1 : 0);
        // pick last element of each bucket
        pos += (bucket_size-1);
        local_splitters[i] = *pos;
        ++pos;
    }

    // sort splitters using parallel bitonic sort
    bitonic_sort(local_splitters.begin(), local_splitters.end(), comp, comm);

    // select the last element on each process but the last
    value_type my_splitter = local_splitters.back();
    // allgather splitters (from all but the last processor)
    std::vector<size_t> recv_sizes(comm.size(), 1);
    recv_sizes.back() = 0;
    std::vector<value_type> result_splitters = mxx::allgatherv(&my_splitter, (comm.rank() + 1 < comm.size()) ? 1 : 0, recv_sizes, comm);

    // return resulting splitters
    return result_splitters;
}